

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evotiming.c
# Opt level: O0

int evosend(int cnum,int c,int m,int d)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t in_ECX;
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  uint32_t ctrl;
  
  if (nva_cards[in_EDI].chipset < 0xd0) {
    if ((nva_cards[in_EDI].chipset != 0x50) && (nva_cards[in_EDI].chipset < 0x84)) {
      fprintf(_stderr,"unsupported chipset\n");
      return 1;
    }
    uVar1 = nva_rd32(in_EDI,in_ESI * 8 + 0x610300);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610300,uVar1 | 1);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610304,in_ECX);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610300,in_EDX | 0x80000001);
    do {
      uVar2 = nva_rd32(in_EDI,in_ESI * 8 + 0x610300);
    } while ((uVar2 & 0x80000000) != 0);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610300,uVar1);
  }
  else {
    uVar1 = nva_rd32(in_EDI,in_ESI * 8 + 0x610700);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610700,uVar1 | 1);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610704,in_ECX);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610700,in_EDX | 0x80000001);
    do {
      uVar2 = nva_rd32(in_EDI,in_ESI * 8 + 0x610700);
    } while ((uVar2 & 0x80000000) != 0);
    nva_wr32(in_EDI,in_ESI * 8 + 0x610700,uVar1);
  }
  return 0;
}

Assistant:

int evosend (int cnum, int c, int m, int d)
{
	uint32_t ctrl;

	if (nva_cards[cnum].chipset >= 0xd0) {
		ctrl = nva_rd32(cnum, 0x610700 + (c * 8));
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610704 + (c * 8), d);
		nva_wr32(cnum, 0x610700 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610700 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl);
	} else
	if (nva_cards[cnum].chipset == 0x50 ||
	    nva_cards[cnum].chipset >= 0x84) {
		ctrl = nva_rd32(cnum, 0x610300 + (c * 8));
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610304 + (c * 8), d);
		nva_wr32(cnum, 0x610300 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610300 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl);
	} else {
		fprintf (stderr, "unsupported chipset\n");
		return 1;
	}

	return 0;
}